

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O0

void collectSubDependencies(void)

{
  bool bVar1;
  size_type sVar2;
  string original_path;
  size_t n;
  size_t dep_amount;
  Dependency *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string local_50 [32];
  string local_30 [32];
  ulong local_10;
  size_type local_8;
  
  local_8 = std::vector<Dependency,_std::allocator<Dependency>_>::size(&deps);
  do {
    local_8 = std::vector<Dependency,_std::allocator<Dependency>_>::size(&deps);
    for (local_10 = 0; local_10 < local_8; local_10 = local_10 + 1) {
      std::operator<<((ostream *)&std::cout,".");
      fflush(_stdout);
      std::vector<Dependency,_std::allocator<Dependency>_>::operator[](&deps,local_10);
      Dependency::getOriginalPath_abi_cxx11_(in_stack_ffffffffffffff98);
      bVar1 = isRpath(in_stack_ffffffffffffffa0);
      if (bVar1) {
        searchFilenameInRpaths(&in_stack_ffffffffffffff98->filename);
        std::__cxx11::string::operator=(local_30,local_50);
        std::__cxx11::string::~string(local_50);
      }
      collectDependencies((string *)original_path._M_string_length);
      std::__cxx11::string::~string(local_30);
    }
    sVar2 = std::vector<Dependency,_std::allocator<Dependency>_>::size(&deps);
  } while (sVar2 != local_8);
  return;
}

Assistant:

void collectSubDependencies()
{
    // print status to user
    size_t dep_amount = deps.size();
    
    // recursively collect each dependencie's dependencies
    while(true)
    {
        dep_amount = deps.size();
        for (size_t n=0; n<dep_amount; n++)
        {
            std::cout << "."; fflush(stdout);
            std::string original_path = deps[n].getOriginalPath();
            if (isRpath(original_path)) original_path = searchFilenameInRpaths(original_path);

            collectDependencies(original_path);
        }
        
        if(deps.size() == dep_amount) break; // no more dependencies were added on this iteration, stop searching
    }
}